

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

void __thiscall cimg_library::CImgDisplay::_handle_events(CImgDisplay *this,XEvent *pevent)

{
  Display *pDVar1;
  int iVar2;
  X11_static *pXVar3;
  bool is_pressed;
  uint button;
  int iVar4;
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  char tmp_1;
  char tmp;
  XEvent event;
  KeySym ksym;
  int local_5c;
  
  pXVar3 = cimg::X11_attr();
  pDVar1 = pXVar3->display;
  memcpy(&event,pevent,0xc0);
  if (0x14 < event.type - 2U) {
    if (event.type != 0x21) {
      return;
    }
    if (event.xfocus.mode != (int)this->_wm_protocol_atom) {
      return;
    }
    if (event.xexpose.count != (int)this->_wm_window_atom) {
      return;
    }
    pXVar3 = cimg::X11_attr();
    XUnmapWindow(pXVar3->display,this->_window);
    this->_is_event = true;
    this->_is_closed = true;
    pXVar3 = cimg::X11_attr();
    pthread_cond_broadcast((pthread_cond_t *)&pXVar3->wait_event);
    return;
  }
  iVar2 = (&switchD_00190c29::switchdataD_0023a1e0)[event.type - 2U] + 0x23a1e0;
  switch(event.type) {
  case 2:
    _tmp = _tmp & 0xffffff00;
    XLookupString(&event,&tmp,1,&ksym,0);
    is_pressed = true;
    goto LAB_00190f87;
  case 3:
    XQueryKeymap(pDVar1,&ksym);
    if ((event.xkey.keycode < 0x100) &&
       ((*(byte *)((long)&ksym + (ulong)(event.xkey.keycode >> 3)) >> (event.xkey.keycode & 7) & 1)
        != 0)) {
      return;
    }
    tmp_1 = '\0';
    XLookupString(&event,&tmp_1,1,&tmp,0);
    is_pressed = false;
    ksym._0_4_ = _tmp;
LAB_00190f87:
    set_key(this,(uint)ksym,is_pressed);
    break;
  case 4:
    do {
      iVar5 = (int)event.pad[8];
      this->_mouse_x = iVar5;
      iVar4 = (int)((ulong)event._64_8_ >> 0x20);
      this->_mouse_y = iVar4;
      auVar7._0_4_ = -(uint)(iVar5 < (int)this->_width);
      auVar7._4_4_ = -(uint)(iVar4 < (int)this->_height);
      auVar7._8_4_ = -(uint)(-1 < iVar5);
      auVar7._12_4_ = -(uint)(-1 < event.pad[8]);
      iVar2 = movmskps(iVar2,auVar7);
      if (iVar2 != 0xf) {
        this->_mouse_x = -1;
        this->_mouse_y = -1;
      }
      if (event.xkey.keycode - 1 < 3) {
        set_button(this,*(uint *)(&DAT_002762f0 + (ulong)(event.xkey.keycode - 1) * 4),true);
      }
      iVar2 = XCheckWindowEvent(pDVar1,this->_window,4,&event);
    } while (iVar2 != 0);
    break;
  case 5:
    do {
      iVar5 = (int)event.pad[8];
      this->_mouse_x = iVar5;
      iVar4 = (int)((ulong)event._64_8_ >> 0x20);
      this->_mouse_y = iVar4;
      auVar8._0_4_ = -(uint)(iVar5 < (int)this->_width);
      auVar8._4_4_ = -(uint)(iVar4 < (int)this->_height);
      auVar8._8_4_ = -(uint)(-1 < iVar5);
      auVar8._12_4_ = -(uint)(-1 < event.pad[8]);
      iVar2 = movmskps(iVar2,auVar8);
      if (iVar2 != 0xf) {
        this->_mouse_x = -1;
        this->_mouse_y = -1;
      }
      button = 1;
      switch(event.xkey.keycode) {
      case 1:
        break;
      case 2:
        button = 3;
        break;
      case 3:
        button = 2;
        break;
      case 4:
        goto LAB_00190ef4;
      case 5:
        button = 0xffffffff;
LAB_00190ef4:
        set_wheel(this,button);
      default:
        goto switchD_00190ed7_default;
      }
      set_button(this,button,false);
switchD_00190ed7_default:
      iVar2 = XCheckWindowEvent(pDVar1,this->_window,8,&event);
    } while (iVar2 != 0);
    break;
  case 6:
    do {
      iVar2 = XCheckWindowEvent(pDVar1,this->_window,0x40,&event);
    } while (iVar2 != 0);
    iVar2 = (int)event.pad[8];
    this->_mouse_x = iVar2;
    iVar5 = (int)((ulong)event._64_8_ >> 0x20);
    this->_mouse_y = iVar5;
    auVar6._0_4_ = -(uint)(iVar2 < (int)this->_width);
    auVar6._4_4_ = -(uint)(iVar5 < (int)this->_height);
    auVar6._8_4_ = -(uint)(-1 < iVar2);
    auVar6._12_4_ = -(uint)(-1 < event.pad[8]);
    iVar2 = movmskps(0,auVar6);
    if (iVar2 != 0xf) goto LAB_00190dda;
    goto LAB_00190ddf;
  case 7:
    do {
      iVar2 = XCheckWindowEvent(pDVar1,this->_window,0x10,&event);
    } while (iVar2 != 0);
    iVar2 = (int)event.pad[8];
    this->_mouse_x = iVar2;
    iVar5 = (int)((ulong)event._64_8_ >> 0x20);
    this->_mouse_y = iVar5;
    auVar9._0_4_ = -(uint)(iVar2 < (int)this->_width);
    auVar9._4_4_ = -(uint)(iVar5 < (int)this->_height);
    auVar9._8_4_ = -(uint)(-1 < iVar2);
    auVar9._12_4_ = -(uint)(-1 < event.pad[8]);
    iVar2 = movmskps(0,auVar9);
    if (iVar2 != 0xf) {
      this->_mouse_x = -1;
      this->_mouse_y = -1;
    }
    break;
  case 8:
    do {
      iVar2 = XCheckWindowEvent(pDVar1,this->_window,0x20,&event);
    } while (iVar2 != 0);
LAB_00190dda:
    this->_mouse_x = -1;
    this->_mouse_y = -1;
LAB_00190ddf:
    this->_is_event = true;
LAB_00190de3:
    pXVar3 = cimg::X11_attr();
    pthread_cond_broadcast((pthread_cond_t *)&pXVar3->wait_event);
    break;
  case 0xc:
    do {
      iVar2 = XCheckWindowEvent(pDVar1,this->_window,0x8000,&event);
    } while (iVar2 != 0);
    _paint(this,false);
    if (this->_is_fullscreen == true) {
      do {
        XGetWindowAttributes(pDVar1,this->_window,&ksym);
        if (local_5c == 2) break;
        XSync(pDVar1,0);
        cimg::sleep(10);
      } while (local_5c != 2);
      XSetInputFocus(pDVar1,this->_window,2,0);
    }
    break;
  case 0x16:
    do {
      iVar2 = XCheckWindowEvent(pDVar1,this->_window,0x20000,&event);
    } while (iVar2 != 0);
    if ((event.xgraphicsexpose.major_code != 0 && event.xexpose.count != 0) &&
       ((event.xexpose.count != this->_window_width ||
        (event.xgraphicsexpose.major_code != this->_window_height)))) {
      this->_window_width = event.xexpose.count;
      this->_window_height = event.xgraphicsexpose.major_code;
      this->_mouse_x = -1;
      this->_mouse_y = -1;
      XResizeWindow(pDVar1,this->_window);
      this->_is_event = true;
      this->_is_resized = true;
      pXVar3 = cimg::X11_attr();
      pthread_cond_broadcast((pthread_cond_t *)&pXVar3->wait_event);
    }
    if ((event.xexpose.width == this->_window_x) && (event.xexpose.height == this->_window_y)) {
      return;
    }
    this->_window_x = event.xexpose.width;
    this->_window_y = event.xexpose.height;
    this->_is_moved = true;
    this->_is_event = true;
    goto LAB_00190de3;
  }
  return;
}

Assistant:

void _handle_events(const XEvent *const pevent) {
      Display *const dpy = cimg::X11_attr().display;
      XEvent event = *pevent;
      switch (event.type) {
      case ClientMessage : {
        if ((int)event.xclient.message_type==(int)_wm_protocol_atom &&
            (int)event.xclient.data.l[0]==(int)_wm_window_atom) {
          XUnmapWindow(cimg::X11_attr().display,_window);
          _is_closed = _is_event = true;
          pthread_cond_broadcast(&cimg::X11_attr().wait_event);
        }
      } break;
      case ConfigureNotify : {
        while (XCheckWindowEvent(dpy,_window,StructureNotifyMask,&event)) {}
        const unsigned int nw = event.xconfigure.width, nh = event.xconfigure.height;
        const int nx = event.xconfigure.x, ny = event.xconfigure.y;
        if (nw && nh && (nw!=_window_width || nh!=_window_height)) {
          _window_width = nw; _window_height = nh; _mouse_x = _mouse_y = -1;
          XResizeWindow(dpy,_window,_window_width,_window_height);
          _is_resized = _is_event = true;
          pthread_cond_broadcast(&cimg::X11_attr().wait_event);
        }
        if (nx!=_window_x || ny!=_window_y) {
          _window_x = nx;
          _window_y = ny;
          _is_moved = _is_event = true;
          pthread_cond_broadcast(&cimg::X11_attr().wait_event);
        }
      } break;
      case Expose : {
        while (XCheckWindowEvent(dpy,_window,ExposureMask,&event)) {}
        _paint(false);
        if (_is_fullscreen) {
          XWindowAttributes attr;
          do {
            XGetWindowAttributes(dpy,_window,&attr);
            if (attr.map_state!=IsViewable) { XSync(dpy,0); cimg::sleep(10); }
          } while (attr.map_state!=IsViewable);
          XSetInputFocus(dpy,_window,RevertToParent,CurrentTime);
        }
      } break;
      case ButtonPress : {
        do {
          _mouse_x = event.xmotion.x; _mouse_y = event.xmotion.y;
          if (_mouse_x<0 || _mouse_y<0 || _mouse_x>=width() || _mouse_y>=height()) _mouse_x = _mouse_y = -1;
          switch (event.xbutton.button) {
          case 1 : set_button(1); break;
          case 3 : set_button(2); break;
          case 2 : set_button(3); break;
          }
        } while (XCheckWindowEvent(dpy,_window,ButtonPressMask,&event));
      } break;
      case ButtonRelease : {
        do {
          _mouse_x = event.xmotion.x; _mouse_y = event.xmotion.y;
          if (_mouse_x<0 || _mouse_y<0 || _mouse_x>=width() || _mouse_y>=height()) _mouse_x = _mouse_y = -1;
          switch (event.xbutton.button) {
          case 1 : set_button(1,false); break;
          case 3 : set_button(2,false); break;
          case 2 : set_button(3,false); break;
          case 4 : set_wheel(1); break;
          case 5 : set_wheel(-1); break;
          }
        } while (XCheckWindowEvent(dpy,_window,ButtonReleaseMask,&event));
      } break;
      case KeyPress : {
        char tmp = 0; KeySym ksym;
        XLookupString(&event.xkey,&tmp,1,&ksym,0);
        set_key((unsigned int)ksym,true);
      } break;
      case KeyRelease : {
        char keys_return[32];  // Check that the key has been physically unpressed
        XQueryKeymap(dpy,keys_return);
        const unsigned int kc = event.xkey.keycode, kc1 = kc/8, kc2 = kc%8;
        const bool is_key_pressed = kc1>=32?false:(keys_return[kc1]>>kc2)&1;
        if (!is_key_pressed) {
          char tmp = 0; KeySym ksym;
          XLookupString(&event.xkey,&tmp,1,&ksym,0);
          set_key((unsigned int)ksym,false);
        }
      } break;
      case EnterNotify: {
        while (XCheckWindowEvent(dpy,_window,EnterWindowMask,&event)) {}
        _mouse_x = event.xmotion.x;
        _mouse_y = event.xmotion.y;
        if (_mouse_x<0 || _mouse_y<0 || _mouse_x>=width() || _mouse_y>=height()) _mouse_x = _mouse_y = -1;
      } break;
      case LeaveNotify : {
        while (XCheckWindowEvent(dpy,_window,LeaveWindowMask,&event)) {}
        _mouse_x = _mouse_y = -1; _is_event = true;
        pthread_cond_broadcast(&cimg::X11_attr().wait_event);
      } break;
      case MotionNotify : {
        while (XCheckWindowEvent(dpy,_window,PointerMotionMask,&event)) {}
        _mouse_x = event.xmotion.x;
        _mouse_y = event.xmotion.y;
        if (_mouse_x<0 || _mouse_y<0 || _mouse_x>=width() || _mouse_y>=height()) _mouse_x = _mouse_y = -1;
        _is_event = true;
        pthread_cond_broadcast(&cimg::X11_attr().wait_event);
      } break;
      }
    }